

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyStateTransitionDesc
               (IRenderDevice *pDevice,StateTransitionDesc *Barrier,
               DeviceContextIndex ExecutionCtxId,DeviceContextDesc *CtxDesc)

{
  STATE_TRANSITION_TYPE SVar1;
  uint uVar2;
  RefCntAutoPtr<Diligent::ITexture> RVar3;
  STATE_TRANSITION_FLAGS SVar4;
  STATE_TRANSITION_FLAGS SVar5;
  bool bVar6;
  Uint32 UVar7;
  Uint32 UVar8;
  int iVar9;
  Uint32 UVar10;
  Char *pCVar11;
  ITexture *pIVar12;
  TextureDesc *this;
  undefined4 extraout_var_00;
  IBuffer *pIVar13;
  char (*Args_1) [41];
  IBottomLevelAS *pIVar14;
  char (*pacVar15) [39];
  ITopLevelAS *pIVar16;
  undefined4 extraout_var_03;
  char (*Args_1_00) [71];
  char (*Args_1_01) [75];
  TextureDesc *in_R9;
  char *in_stack_fffffffffffffae8;
  char (*in_stack_fffffffffffffaf0) [15];
  char *in_stack_fffffffffffffaf8;
  char (*in_stack_fffffffffffffb00) [15];
  RESOURCE_STATE local_4cc;
  RESOURCE_STATE local_4bc;
  RESOURCE_STATE local_4a8;
  RESOURCE_STATE local_440;
  undefined1 local_408 [8];
  string msg_26;
  string msg_25;
  string msg_24;
  string msg_23;
  string msg_22;
  string msg_21;
  string msg_20;
  string msg_19;
  TopLevelASDesc *TLASDesc;
  RefCntAutoPtr<Diligent::ITopLevelAS> pTopLevelAS;
  string msg_18;
  string msg_17;
  string msg_16;
  BottomLevelASDesc *BLASDesc;
  RefCntAutoPtr<Diligent::IBottomLevelAS> pBottomLevelAS;
  string msg_15;
  string msg_14;
  string msg_13;
  BufferDesc *BuffDesc;
  RefCntAutoPtr<Diligent::IBuffer> pBuffer;
  string msg_12;
  string msg_11;
  Uint32 local_1d0;
  RENDER_DEVICE_TYPE DeviceType;
  undefined1 local_1c8 [8];
  string msg_10;
  undefined1 local_1a0 [8];
  string msg_9;
  undefined1 local_178 [8];
  string msg_8;
  string msg_7;
  string msg_6;
  string msg_5;
  string msg_4;
  TextureDesc *TexDesc;
  RefCntAutoPtr<Diligent::ITexture> pTexture;
  Uint64 ImmediateContextMask;
  undefined1 local_b8 [4];
  RESOURCE_STATE OldState;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  DeviceContextDesc *CtxDesc_local;
  StateTransitionDesc *Barrier_local;
  IRenderDevice *pDevice_local;
  DeviceContextIndex ExecutionCtxId_local;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  SVar5 = STATE_TRANSITION_FLAG_ALIASING;
  msg.field_2._8_8_ = CtxDesc;
  pDevice_local._6_1_ = ExecutionCtxId.m_Value;
  SVar4 = operator&(Barrier->Flags,STATE_TRANSITION_FLAG_ALIASING);
  if (SVar4 == STATE_TRANSITION_FLAG_NONE) {
    if (Barrier->pResourceBefore != (IDeviceObject *)0x0) {
      FormatString<char[42],char[77]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])
                 "pResourceBefore is only used for aliasing barrier and must be null otherwise",
                 (char (*) [77])CtxDesc);
      pCVar11 = (Char *)std::__cxx11::string::c_str();
      CtxDesc = (DeviceContextDesc *)0x1e8;
      DebugAssertionFailed
                (pCVar11,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1e8);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    if ((Barrier->NewState == RESOURCE_STATE_UNKNOWN) ||
       (Barrier->NewState == RESOURCE_STATE_UNDEFINED)) {
      FormatString<char[42],char[42]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"NewState must not be UNKNOWN or UNDEFINED",(char (*) [42])CtxDesc);
      pCVar11 = (Char *)std::__cxx11::string::c_str();
      CtxDesc = (DeviceContextDesc *)0x1ea;
      DebugAssertionFailed
                (pCVar11,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1ea);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    if (Barrier->pResource == (IDeviceObject *)0x0) {
      FormatString<char[42],char[28]>
                ((string *)local_b8,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"pResource must not be null.",(char (*) [28])CtxDesc);
      pCVar11 = (Char *)std::__cxx11::string::c_str();
      CtxDesc = (DeviceContextDesc *)0x1ed;
      DebugAssertionFailed
                (pCVar11,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1ed);
      std::__cxx11::string::~string((string *)local_b8);
    }
    ImmediateContextMask._4_4_ = RESOURCE_STATE_UNKNOWN;
    pTexture.m_pObject = (ITexture *)0x0;
    RefCntAutoPtr<Diligent::ITexture>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::ITexture> *)&TexDesc,&Barrier->pResource->super_IObject,
               (INTERFACE_ID *)IID_Texture);
    bVar6 = RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&TexDesc);
    if (bVar6) {
      pIVar12 = RefCntAutoPtr<Diligent::ITexture>::operator->
                          ((RefCntAutoPtr<Diligent::ITexture> *)&TexDesc);
      iVar9 = (*(pIVar12->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      this = (TextureDesc *)CONCAT44(extraout_var,iVar9);
      pTexture.m_pObject = (ITexture *)this->ImmediateContextMask;
      bVar6 = VerifyResourceStates(Barrier->NewState,true);
      if (!bVar6) {
        FormatString<char[42],char[42],char_const*,char[3]>
                  ((string *)((long)&msg_5.field_2 + 8),
                   (Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"invalid new state specified for texture \'",(char (*) [42])this,
                   (char **)"\'.",(char (*) [3])in_R9);
        pCVar11 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar11,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x1f7);
        std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
      }
      if (Barrier->OldState == RESOURCE_STATE_UNKNOWN) {
        pIVar12 = RefCntAutoPtr<Diligent::ITexture>::operator->
                            ((RefCntAutoPtr<Diligent::ITexture> *)&TexDesc);
        local_440 = (*(pIVar12->super_IDeviceObject).super_IObject._vptr_IObject[0xc])();
      }
      else {
        local_440 = Barrier->OldState;
      }
      ImmediateContextMask._4_4_ = local_440;
      if (local_440 == RESOURCE_STATE_UNKNOWN) {
        FormatString<char[42],char[23],char_const*,char[75]>
                  ((string *)((long)&msg_6.field_2 + 8),
                   (Diligent *)"State transition parameters are invalid: ",(char (*) [42])0xc0d3b5,
                   (char (*) [23])this,
                   (char **)
                   "\' is unknown to the engine and is not explicitly specified in the barrier.",
                   (char (*) [75])in_R9);
        pCVar11 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar11,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x1fb);
        std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
      }
      bVar6 = VerifyResourceStates(local_440,true);
      if (!bVar6) {
        FormatString<char[42],char[42],char_const*,char[3]>
                  ((string *)((long)&msg_7.field_2 + 8),
                   (Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"invalid old state specified for texture \'",(char (*) [42])this,
                   (char **)"\'.",(char (*) [3])in_R9);
        pCVar11 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar11,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x1fc);
        std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
      }
      if (this->MipLevels <= Barrier->FirstMipLevel) {
        in_stack_fffffffffffffae8 = " mip level(s).";
        in_R9 = this;
        FormatString<char[42],char[18],unsigned_int,char[54],char_const*,char[12],unsigned_int,char[15]>
                  ((string *)((long)&msg_8.field_2 + 8),
                   (Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"first mip level (",(char (*) [18])&Barrier->FirstMipLevel,
                   (uint *)") specified by the barrier is out of range. Texture \'",
                   (char (*) [54])this,(char **)"\' has only ",(char (*) [12])&this->MipLevels,
                   (uint *)" mip level(s).",in_stack_fffffffffffffaf0);
        pCVar11 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar11,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x200);
        std::__cxx11::string::~string((string *)(msg_8.field_2._M_local_buf + 8));
      }
      if ((Barrier->MipLevelsCount != 0xffffffff) &&
         (this->MipLevels < Barrier->FirstMipLevel + Barrier->MipLevelsCount)) {
        msg_9.field_2._12_4_ = (Barrier->FirstMipLevel - 1) + Barrier->MipLevelsCount;
        in_stack_fffffffffffffaf8 = " mip level(s).";
        in_stack_fffffffffffffae8 = "\' has only ";
        in_R9 = (TextureDesc *)((long)&msg_9.field_2 + 0xc);
        FormatString<char[42],char[17],unsigned_int,char[3],unsigned_int,char[53],char_const*,char[12],unsigned_int,char[15]>
                  ((string *)local_178,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"mip level range ",(char (*) [17])&Barrier->FirstMipLevel,
                   (uint *)"..",(char (*) [3])in_R9,(uint *)0xcc2b93,(char (*) [53])this,
                   (char **)"\' has only ",(char (*) [12])&this->MipLevels,(uint *)" mip level(s).",
                   in_stack_fffffffffffffb00);
        pCVar11 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar11,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x204);
        std::__cxx11::string::~string((string *)local_178);
      }
      uVar2 = Barrier->FirstArraySlice;
      UVar10 = TextureDesc::GetArraySize(this);
      if (UVar10 <= uVar2) {
        msg_10.field_2._12_4_ = TextureDesc::GetArraySize(this);
        in_R9 = this;
        FormatString<char[42],char[20],unsigned_int,char[68],char_const*,char[6],unsigned_int>
                  ((string *)local_1a0,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"first array slice (",(char (*) [20])&Barrier->FirstArraySlice,
                   (uint *)") specified by the barrier is out of range. Array size of texture \'",
                   (char (*) [68])this,(char **)"\' is ",(char (*) [6])((long)&msg_10.field_2 + 0xc)
                   ,(uint *)in_stack_fffffffffffffae8);
        pCVar11 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar11,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x208);
        std::__cxx11::string::~string((string *)local_1a0);
      }
      if ((Barrier->ArraySliceCount != 0xffffffff) &&
         (UVar10 = Barrier->FirstArraySlice, UVar8 = Barrier->ArraySliceCount,
         UVar7 = TextureDesc::GetArraySize(this), UVar7 < UVar10 + UVar8)) {
        DeviceType = (Barrier->FirstArraySlice - 1) + Barrier->ArraySliceCount;
        local_1d0 = TextureDesc::GetArraySize(this);
        in_stack_fffffffffffffae8 = "\' is ";
        in_R9 = (TextureDesc *)&DeviceType;
        FormatString<char[42],char[19],unsigned_int,char[3],unsigned_int,char[67],char_const*,char[6],unsigned_int>
                  ((string *)local_1c8,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"array slice range ",(char (*) [19])&Barrier->FirstArraySlice,
                   (uint *)"..",(char (*) [3])in_R9,(uint *)0xcc2c0c,(char (*) [67])this,
                   (char **)"\' is ",(char (*) [6])&local_1d0,(uint *)in_stack_fffffffffffffaf8);
        pCVar11 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar11,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x20c);
        std::__cxx11::string::~string((string *)local_1c8);
      }
      iVar9 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
      if ((*(int *)CONCAT44(extraout_var_00,iVar9) != 2) &&
         (*(int *)CONCAT44(extraout_var_00,iVar9) != 5)) {
        if ((Barrier->FirstMipLevel != 0) ||
           ((Barrier->MipLevelsCount != 0xffffffff && (Barrier->MipLevelsCount != this->MipLevels)))
           ) {
          FormatString<char[42],char[31],char_const*,char[60]>
                    ((string *)((long)&msg_12.field_2 + 8),
                     (Diligent *)"State transition parameters are invalid: ",
                     (char (*) [42])"failed to transition texture \'",(char (*) [31])this,
                     (char **)"\': only whole resources can be transitioned on this device.",
                     (char (*) [60])in_R9);
          pCVar11 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar11,"VerifyStateTransitionDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x212);
          std::__cxx11::string::~string((string *)(msg_12.field_2._M_local_buf + 8));
        }
        if ((Barrier->FirstArraySlice != 0) ||
           ((Barrier->ArraySliceCount != 0xffffffff &&
            (UVar10 = Barrier->ArraySliceCount, UVar8 = TextureDesc::GetArraySize(this),
            UVar10 != UVar8)))) {
          FormatString<char[42],char[31],char_const*,char[60]>
                    ((string *)&pBuffer,(Diligent *)"State transition parameters are invalid: ",
                     (char (*) [42])"failed to transition texture \'",(char (*) [31])this,
                     (char **)"\': only whole resources can be transitioned on this device.",
                     (char (*) [60])in_R9);
          pCVar11 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar11,"VerifyStateTransitionDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x214);
          std::__cxx11::string::~string((string *)&pBuffer);
        }
      }
    }
    else {
      RefCntAutoPtr<Diligent::IBuffer>::RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::IBuffer> *)&BuffDesc,&Barrier->pResource->super_IObject,
                 (INTERFACE_ID *)IID_Buffer);
      bVar6 = RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&BuffDesc);
      if (bVar6) {
        pIVar13 = RefCntAutoPtr<Diligent::IBuffer>::operator->
                            ((RefCntAutoPtr<Diligent::IBuffer> *)&BuffDesc);
        iVar9 = (*(pIVar13->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        Args_1 = (char (*) [41])CONCAT44(extraout_var_01,iVar9);
        pTexture.m_pObject = *(ITexture **)(*Args_1 + 0x20);
        bVar6 = VerifyResourceStates(Barrier->NewState,false);
        if (!bVar6) {
          FormatString<char[42],char[41],char_const*,char[3]>
                    ((string *)((long)&msg_14.field_2 + 8),
                     (Diligent *)"State transition parameters are invalid: ",
                     (char (*) [42])"invalid new state specified for buffer \'",Args_1,
                     (char **)"\'.",(char (*) [3])in_R9);
          pCVar11 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar11,"VerifyStateTransitionDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x21b);
          std::__cxx11::string::~string((string *)(msg_14.field_2._M_local_buf + 8));
        }
        if (Barrier->OldState == RESOURCE_STATE_UNKNOWN) {
          pIVar13 = RefCntAutoPtr<Diligent::IBuffer>::operator->
                              ((RefCntAutoPtr<Diligent::IBuffer> *)&BuffDesc);
          local_4a8 = (*(pIVar13->super_IDeviceObject).super_IObject._vptr_IObject[0xc])();
        }
        else {
          local_4a8 = Barrier->OldState;
        }
        ImmediateContextMask._4_4_ = local_4a8;
        if (local_4a8 == RESOURCE_STATE_UNKNOWN) {
          FormatString<char[42],char[22],char_const*,char[75]>
                    ((string *)((long)&msg_15.field_2 + 8),
                     (Diligent *)"State transition parameters are invalid: ",(char (*) [42])0xc0d50e
                     ,(char (*) [22])Args_1,
                     (char **)
                     "\' is unknown to the engine and is not explicitly specified in the barrier.",
                     (char (*) [75])in_R9);
          pCVar11 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar11,"VerifyStateTransitionDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x21d);
          std::__cxx11::string::~string((string *)(msg_15.field_2._M_local_buf + 8));
        }
        bVar6 = VerifyResourceStates(local_4a8,false);
        if (!bVar6) {
          FormatString<char[42],char[41],char_const*,char[3]>
                    ((string *)&pBottomLevelAS,
                     (Diligent *)"State transition parameters are invalid: ",
                     (char (*) [42])"invalid old state specified for buffer \'",Args_1,
                     (char **)"\'.",(char (*) [3])in_R9);
          pCVar11 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar11,"VerifyStateTransitionDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x21e);
          std::__cxx11::string::~string((string *)&pBottomLevelAS);
        }
      }
      else {
        RefCntAutoPtr<Diligent::IBottomLevelAS>::RefCntAutoPtr
                  ((RefCntAutoPtr<Diligent::IBottomLevelAS> *)&BLASDesc,
                   &Barrier->pResource->super_IObject,(INTERFACE_ID *)IID_BottomLevelAS);
        bVar6 = RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&BLASDesc);
        if (bVar6) {
          pIVar14 = RefCntAutoPtr<Diligent::IBottomLevelAS>::operator->
                              ((RefCntAutoPtr<Diligent::IBottomLevelAS> *)&BLASDesc);
          iVar9 = (*(pIVar14->super_IDeviceObject).super_IObject._vptr_IObject[4])();
          pacVar15 = (char (*) [39])CONCAT44(extraout_var_02,iVar9);
          pTexture.m_pObject = *(ITexture **)(pacVar15[1] + 9);
          if (Barrier->OldState == RESOURCE_STATE_UNKNOWN) {
            pIVar14 = RefCntAutoPtr<Diligent::IBottomLevelAS>::operator->
                                ((RefCntAutoPtr<Diligent::IBottomLevelAS> *)&BLASDesc);
            local_4bc = (*(pIVar14->super_IDeviceObject).super_IObject._vptr_IObject[0xe])();
          }
          else {
            local_4bc = Barrier->OldState;
          }
          ImmediateContextMask._4_4_ = local_4bc;
          if (local_4bc == RESOURCE_STATE_UNKNOWN) {
            FormatString<char[42],char[20],char_const*,char[75]>
                      ((string *)((long)&msg_17.field_2 + 8),
                       (Diligent *)"State transition parameters are invalid: ",
                       (char (*) [42])0xc0d5e0,(char (*) [20])pacVar15,
                       (char **)
                       "\' is unknown to the engine and is not explicitly specified in the barrier."
                       ,(char (*) [75])in_R9);
            pCVar11 = (Char *)std::__cxx11::string::c_str();
            CtxDesc = (DeviceContextDesc *)0x225;
            DebugAssertionFailed
                      (pCVar11,"VerifyStateTransitionDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x225);
            std::__cxx11::string::~string((string *)(msg_17.field_2._M_local_buf + 8));
          }
          if ((Barrier->NewState != RESOURCE_STATE_BUILD_AS_READ) &&
             (Barrier->NewState != RESOURCE_STATE_BUILD_AS_WRITE)) {
            FormatString<char[42],char[39],char_const*,char[3]>
                      ((string *)((long)&msg_18.field_2 + 8),
                       (Diligent *)"State transition parameters are invalid: ",
                       (char (*) [42])"invalid new state specified for BLAS \'",pacVar15,
                       (char **)"\'.",(char (*) [3])in_R9);
            pCVar11 = (Char *)std::__cxx11::string::c_str();
            CtxDesc = (DeviceContextDesc *)0x227;
            DebugAssertionFailed
                      (pCVar11,"VerifyStateTransitionDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x227);
            std::__cxx11::string::~string((string *)(msg_18.field_2._M_local_buf + 8));
          }
          if (Barrier->TransitionType != STATE_TRANSITION_TYPE_IMMEDIATE) {
            FormatString<char[42],char[43]>
                      ((string *)&pTopLevelAS,
                       (Diligent *)"State transition parameters are invalid: ",
                       (char (*) [42])"split barriers are not supported for BLAS.",
                       (char (*) [43])CtxDesc);
            pCVar11 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar11,"VerifyStateTransitionDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x228);
            std::__cxx11::string::~string((string *)&pTopLevelAS);
          }
        }
        else {
          RefCntAutoPtr<Diligent::ITopLevelAS>::RefCntAutoPtr
                    ((RefCntAutoPtr<Diligent::ITopLevelAS> *)&TLASDesc,
                     &Barrier->pResource->super_IObject,(INTERFACE_ID *)IID_TopLevelAS);
          bVar6 = RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&TLASDesc);
          if (bVar6) {
            pIVar16 = RefCntAutoPtr<Diligent::ITopLevelAS>::operator->
                                ((RefCntAutoPtr<Diligent::ITopLevelAS> *)&TLASDesc);
            iVar9 = (*(pIVar16->super_IDeviceObject).super_IObject._vptr_IObject[4])();
            pacVar15 = (char (*) [39])CONCAT44(extraout_var_03,iVar9);
            pTexture.m_pObject = *(ITexture **)(*pacVar15 + 0x18);
            if (Barrier->OldState == RESOURCE_STATE_UNKNOWN) {
              pIVar16 = RefCntAutoPtr<Diligent::ITopLevelAS>::operator->
                                  ((RefCntAutoPtr<Diligent::ITopLevelAS> *)&TLASDesc);
              local_4cc = (*(pIVar16->super_IDeviceObject).super_IObject._vptr_IObject[0xd])();
            }
            else {
              local_4cc = Barrier->OldState;
            }
            ImmediateContextMask._4_4_ = local_4cc;
            if (local_4cc == RESOURCE_STATE_UNKNOWN) {
              FormatString<char[42],char[20],char_const*,char[75]>
                        ((string *)((long)&msg_20.field_2 + 8),
                         (Diligent *)"State transition parameters are invalid: ",
                         (char (*) [42])0xc0d661,(char (*) [20])pacVar15,
                         (char **)
                         "\' is unknown to the engine and is not explicitly specified in the barrier."
                         ,(char (*) [75])in_R9);
              pCVar11 = (Char *)std::__cxx11::string::c_str();
              CtxDesc = (DeviceContextDesc *)0x22f;
              DebugAssertionFailed
                        (pCVar11,"VerifyStateTransitionDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x22f);
              std::__cxx11::string::~string((string *)(msg_20.field_2._M_local_buf + 8));
            }
            if (((Barrier->NewState != RESOURCE_STATE_BUILD_AS_READ) &&
                (Barrier->NewState != RESOURCE_STATE_BUILD_AS_WRITE)) &&
               (Barrier->NewState != RESOURCE_STATE_RAY_TRACING)) {
              FormatString<char[42],char[39],char_const*,char[3]>
                        ((string *)((long)&msg_21.field_2 + 8),
                         (Diligent *)"State transition parameters are invalid: ",
                         (char (*) [42])"invalid new state specified for TLAS \'",pacVar15,
                         (char **)"\'.",(char (*) [3])in_R9);
              pCVar11 = (Char *)std::__cxx11::string::c_str();
              CtxDesc = (DeviceContextDesc *)0x231;
              DebugAssertionFailed
                        (pCVar11,"VerifyStateTransitionDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x231);
              std::__cxx11::string::~string((string *)(msg_21.field_2._M_local_buf + 8));
            }
            if (Barrier->TransitionType != STATE_TRANSITION_TYPE_IMMEDIATE) {
              FormatString<char[42],char[43]>
                        ((string *)((long)&msg_22.field_2 + 8),
                         (Diligent *)"State transition parameters are invalid: ",
                         (char (*) [42])"split barriers are not supported for TLAS.",
                         (char (*) [43])CtxDesc);
              pCVar11 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar11,"VerifyStateTransitionDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x232);
              std::__cxx11::string::~string((string *)(msg_22.field_2._M_local_buf + 8));
            }
          }
          else {
            FormatString<char[26]>
                      ((string *)((long)&msg_23.field_2 + 8),
                       (char (*) [26])"unsupported resource type");
            pCVar11 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar11,"VerifyStateTransitionDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x236);
            std::__cxx11::string::~string((string *)(msg_23.field_2._M_local_buf + 8));
          }
          RefCntAutoPtr<Diligent::ITopLevelAS>::~RefCntAutoPtr
                    ((RefCntAutoPtr<Diligent::ITopLevelAS> *)&TLASDesc);
        }
        RefCntAutoPtr<Diligent::IBottomLevelAS>::~RefCntAutoPtr
                  ((RefCntAutoPtr<Diligent::IBottomLevelAS> *)&BLASDesc);
      }
      RefCntAutoPtr<Diligent::IBuffer>::~RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::IBuffer> *)&BuffDesc);
    }
    RefCntAutoPtr<Diligent::ITexture>::~RefCntAutoPtr((RefCntAutoPtr<Diligent::ITexture> *)&TexDesc)
    ;
    RVar3 = pTexture;
    UVar10 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&pDevice_local + 6))
    ;
    Args_1_01 = (char (*) [75])(1L << ((byte)UVar10 & 0x3f));
    if (((ulong)RVar3.m_pObject & (ulong)Args_1_01) == 0) {
      FormatString<char[42],char[50],std::ios_base&(std::ios_base&),unsigned_long,char[41],char_const*,char[3]>
                ((string *)((long)&msg_24.field_2 + 8),
                 (Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"resource was created with ImmediateContextMask 0x",
                 (char (*) [50])std::hex,(_func_ios_base_ptr_ios_base_ptr *)&pTexture,
                 (unsigned_long *)" and can not be used in device context \'",
                 (char (*) [41])msg.field_2._8_8_,(char **)"\'.",
                 (char (*) [3])in_stack_fffffffffffffae8);
      pCVar11 = (Char *)std::__cxx11::string::c_str();
      Args_1_01 = (char (*) [75])0x23a;
      DebugAssertionFailed
                (pCVar11,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x23a);
      std::__cxx11::string::~string((string *)(msg_24.field_2._M_local_buf + 8));
    }
    if (((ImmediateContextMask._4_4_ == RESOURCE_STATE_UNORDERED_ACCESS) &&
        (Barrier->NewState == RESOURCE_STATE_UNORDERED_ACCESS)) &&
       (Barrier->TransitionType != STATE_TRANSITION_TYPE_IMMEDIATE)) {
      FormatString<char[42],char[75]>
                ((string *)((long)&msg_25.field_2 + 8),
                 (Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])
                 "for UAV barriers, transition type must be STATE_TRANSITION_TYPE_IMMEDIATE.",
                 Args_1_01);
      pCVar11 = (Char *)std::__cxx11::string::c_str();
      Args_1_01 = (char (*) [75])0x23f;
      DebugAssertionFailed
                (pCVar11,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x23f);
      std::__cxx11::string::~string((string *)(msg_25.field_2._M_local_buf + 8));
    }
    SVar1 = Barrier->TransitionType;
    if (SVar1 != STATE_TRANSITION_TYPE_IMMEDIATE) {
      if (SVar1 == STATE_TRANSITION_TYPE_BEGIN) {
        SVar4 = operator&(Barrier->Flags,STATE_TRANSITION_FLAG_UPDATE_STATE);
        if (SVar4 != STATE_TRANSITION_FLAG_NONE) {
          FormatString<char[42],char[56]>
                    ((string *)((long)&msg_26.field_2 + 8),
                     (Diligent *)"State transition parameters are invalid: ",
                     (char (*) [42])"resource state can\'t be updated in begin-split barrier.",
                     (char (*) [56])Args_1_01);
          pCVar11 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar11,"VerifyStateTransitionDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x248);
          std::__cxx11::string::~string((string *)(msg_26.field_2._M_local_buf + 8));
        }
      }
      else if (SVar1 != STATE_TRANSITION_TYPE_END) {
        FormatString<char[27]>((string *)local_408,(char (*) [27])"Unexpected transition type");
        pCVar11 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar11,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x24f);
        std::__cxx11::string::~string((string *)local_408);
      }
    }
    VerifyResourceState(Barrier->OldState,*(COMMAND_QUEUE_TYPE *)(msg.field_2._8_8_ + 8),"OldState")
    ;
    VerifyResourceState(Barrier->NewState,*(COMMAND_QUEUE_TYPE *)(msg.field_2._8_8_ + 8),"NewState")
    ;
    pDevice_local._7_1_ = true;
  }
  else {
    SVar4 = Barrier->Flags;
    SVar5 = operator~((Diligent *)0x4,SVar5);
    Args_1_00 = (char (*) [71])CONCAT71((int7)((ulong)CtxDesc >> 8),SVar4);
    SVar4 = operator&(SVar4,SVar5);
    if (SVar4 != STATE_TRANSITION_FLAG_NONE) {
      FormatString<char[42],char[71]>
                ((string *)local_48,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])
                 "STATE_TRANSITION_FLAG_ALIASING flag is not compatible with other flags",Args_1_00)
      ;
      pCVar11 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar11,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1e4);
      std::__cxx11::string::~string((string *)local_48);
    }
    pDevice_local._7_1_ = VerifyAliasingBarrierDesc(Barrier);
  }
  return pDevice_local._7_1_;
}

Assistant:

bool VerifyStateTransitionDesc(const IRenderDevice*       pDevice,
                               const StateTransitionDesc& Barrier,
                               DeviceContextIndex         ExecutionCtxId,
                               const DeviceContextDesc&   CtxDesc)
{
    if (Barrier.Flags & STATE_TRANSITION_FLAG_ALIASING)
    {
        CHECK_STATE_TRANSITION_DESC((Barrier.Flags & ~STATE_TRANSITION_FLAG_ALIASING) == 0,
                                    "STATE_TRANSITION_FLAG_ALIASING flag is not compatible with other flags");
        return VerifyAliasingBarrierDesc(Barrier);
    }

    CHECK_STATE_TRANSITION_DESC(Barrier.pResourceBefore == nullptr, "pResourceBefore is only used for aliasing barrier and must be null otherwise");
    CHECK_STATE_TRANSITION_DESC(Barrier.NewState != RESOURCE_STATE_UNKNOWN && Barrier.NewState != RESOURCE_STATE_UNDEFINED,
                                "NewState must not be UNKNOWN or UNDEFINED");


    CHECK_STATE_TRANSITION_DESC(Barrier.pResource != nullptr, "pResource must not be null.");

    RESOURCE_STATE OldState             = RESOURCE_STATE_UNKNOWN;
    Uint64         ImmediateContextMask = 0;

    if (RefCntAutoPtr<ITexture> pTexture{Barrier.pResource, IID_Texture})
    {
        const TextureDesc& TexDesc = pTexture->GetDesc();
        ImmediateContextMask       = TexDesc.ImmediateContextMask;

        CHECK_STATE_TRANSITION_DESC(VerifyResourceStates(Barrier.NewState, true), "invalid new state specified for texture '", TexDesc.Name, "'.");
        OldState = Barrier.OldState != RESOURCE_STATE_UNKNOWN ? Barrier.OldState : pTexture->GetState();
        CHECK_STATE_TRANSITION_DESC(OldState != RESOURCE_STATE_UNKNOWN,
                                    "the state of texture '", TexDesc.Name,
                                    "' is unknown to the engine and is not explicitly specified in the barrier.");
        CHECK_STATE_TRANSITION_DESC(VerifyResourceStates(OldState, true), "invalid old state specified for texture '", TexDesc.Name, "'.");

        CHECK_STATE_TRANSITION_DESC(Barrier.FirstMipLevel < TexDesc.MipLevels, "first mip level (", Barrier.FirstMipLevel,
                                    ") specified by the barrier is out of range. Texture '",
                                    TexDesc.Name, "' has only ", TexDesc.MipLevels, " mip level(s).");
        CHECK_STATE_TRANSITION_DESC(Barrier.MipLevelsCount == REMAINING_MIP_LEVELS || Barrier.FirstMipLevel + Barrier.MipLevelsCount <= TexDesc.MipLevels,
                                    "mip level range ", Barrier.FirstMipLevel, "..", Barrier.FirstMipLevel + Barrier.MipLevelsCount - 1,
                                    " specified by the barrier is out of range. Texture '",
                                    TexDesc.Name, "' has only ", TexDesc.MipLevels, " mip level(s).");

        CHECK_STATE_TRANSITION_DESC(Barrier.FirstArraySlice < TexDesc.GetArraySize(), "first array slice (", Barrier.FirstArraySlice,
                                    ") specified by the barrier is out of range. Array size of texture '",
                                    TexDesc.Name, "' is ", TexDesc.GetArraySize());
        CHECK_STATE_TRANSITION_DESC(Barrier.ArraySliceCount == REMAINING_ARRAY_SLICES || Barrier.FirstArraySlice + Barrier.ArraySliceCount <= TexDesc.GetArraySize(),
                                    "array slice range ", Barrier.FirstArraySlice, "..", Barrier.FirstArraySlice + Barrier.ArraySliceCount - 1,
                                    " specified by the barrier is out of range. Array size of texture '",
                                    TexDesc.Name, "' is ", TexDesc.GetArraySize());

        RENDER_DEVICE_TYPE DeviceType = pDevice->GetDeviceInfo().Type;
        if (DeviceType != RENDER_DEVICE_TYPE_D3D12 && DeviceType != RENDER_DEVICE_TYPE_VULKAN)
        {
            CHECK_STATE_TRANSITION_DESC(Barrier.FirstMipLevel == 0 && (Barrier.MipLevelsCount == REMAINING_MIP_LEVELS || Barrier.MipLevelsCount == TexDesc.MipLevels),
                                        "failed to transition texture '", TexDesc.Name, "': only whole resources can be transitioned on this device.");
            CHECK_STATE_TRANSITION_DESC(Barrier.FirstArraySlice == 0 && (Barrier.ArraySliceCount == REMAINING_ARRAY_SLICES || Barrier.ArraySliceCount == TexDesc.GetArraySize()),
                                        "failed to transition texture '", TexDesc.Name, "': only whole resources can be transitioned on this device.");
        }
    }
    else if (RefCntAutoPtr<IBuffer> pBuffer{Barrier.pResource, IID_Buffer})
    {
        const BufferDesc& BuffDesc = pBuffer->GetDesc();
        ImmediateContextMask       = BuffDesc.ImmediateContextMask;
        CHECK_STATE_TRANSITION_DESC(VerifyResourceStates(Barrier.NewState, false), "invalid new state specified for buffer '", BuffDesc.Name, "'.");
        OldState = Barrier.OldState != RESOURCE_STATE_UNKNOWN ? Barrier.OldState : pBuffer->GetState();
        CHECK_STATE_TRANSITION_DESC(OldState != RESOURCE_STATE_UNKNOWN, "the state of buffer '", BuffDesc.Name, "' is unknown to the engine and is not explicitly specified in the barrier.");
        CHECK_STATE_TRANSITION_DESC(VerifyResourceStates(OldState, false), "invalid old state specified for buffer '", BuffDesc.Name, "'.");
    }
    else if (RefCntAutoPtr<IBottomLevelAS> pBottomLevelAS{Barrier.pResource, IID_BottomLevelAS})
    {
        const BottomLevelASDesc& BLASDesc = pBottomLevelAS->GetDesc();
        ImmediateContextMask              = BLASDesc.ImmediateContextMask;
        OldState                          = Barrier.OldState != RESOURCE_STATE_UNKNOWN ? Barrier.OldState : pBottomLevelAS->GetState();
        CHECK_STATE_TRANSITION_DESC(OldState != RESOURCE_STATE_UNKNOWN, "the state of BLAS '", BLASDesc.Name, "' is unknown to the engine and is not explicitly specified in the barrier.");
        CHECK_STATE_TRANSITION_DESC(Barrier.NewState == RESOURCE_STATE_BUILD_AS_READ || Barrier.NewState == RESOURCE_STATE_BUILD_AS_WRITE,
                                    "invalid new state specified for BLAS '", BLASDesc.Name, "'.");
        CHECK_STATE_TRANSITION_DESC(Barrier.TransitionType == STATE_TRANSITION_TYPE_IMMEDIATE, "split barriers are not supported for BLAS.");
    }
    else if (RefCntAutoPtr<ITopLevelAS> pTopLevelAS{Barrier.pResource, IID_TopLevelAS})
    {
        const TopLevelASDesc& TLASDesc = pTopLevelAS->GetDesc();
        ImmediateContextMask           = TLASDesc.ImmediateContextMask;
        OldState                       = Barrier.OldState != RESOURCE_STATE_UNKNOWN ? Barrier.OldState : pTopLevelAS->GetState();
        CHECK_STATE_TRANSITION_DESC(OldState != RESOURCE_STATE_UNKNOWN, "the state of TLAS '", TLASDesc.Name, "' is unknown to the engine and is not explicitly specified in the barrier.");
        CHECK_STATE_TRANSITION_DESC(Barrier.NewState == RESOURCE_STATE_BUILD_AS_READ || Barrier.NewState == RESOURCE_STATE_BUILD_AS_WRITE || Barrier.NewState == RESOURCE_STATE_RAY_TRACING,
                                    "invalid new state specified for TLAS '", TLASDesc.Name, "'.");
        CHECK_STATE_TRANSITION_DESC(Barrier.TransitionType == STATE_TRANSITION_TYPE_IMMEDIATE, "split barriers are not supported for TLAS.");
    }
    else
    {
        UNEXPECTED("unsupported resource type");
    }

    CHECK_STATE_TRANSITION_DESC((ImmediateContextMask & (Uint64{1} << Uint64{ExecutionCtxId})) != 0,
                                "resource was created with ImmediateContextMask 0x", std::hex, ImmediateContextMask, " and can not be used in device context '", CtxDesc.Name, "'.");

    if (OldState == RESOURCE_STATE_UNORDERED_ACCESS && Barrier.NewState == RESOURCE_STATE_UNORDERED_ACCESS)
    {
        CHECK_STATE_TRANSITION_DESC(Barrier.TransitionType == STATE_TRANSITION_TYPE_IMMEDIATE,
                                    "for UAV barriers, transition type must be STATE_TRANSITION_TYPE_IMMEDIATE.");
    }

    switch (Barrier.TransitionType)
    {
        case STATE_TRANSITION_TYPE_IMMEDIATE:
            break;

        case STATE_TRANSITION_TYPE_BEGIN:
            CHECK_STATE_TRANSITION_DESC((Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) == 0, "resource state can't be updated in begin-split barrier.");
            break;

        case STATE_TRANSITION_TYPE_END:
            break;

        default:
            UNEXPECTED("Unexpected transition type");
    }

    VerifyResourceState(Barrier.OldState, CtxDesc.QueueType, "OldState");
    VerifyResourceState(Barrier.NewState, CtxDesc.QueueType, "NewState");


    return true;
}